

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::Get(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest,SQUnsignedInteger getflags
         ,SQInteger selfidx)

{
  SQUnsignedInteger *pSVar1;
  char cVar2;
  SQObjectType SVar3;
  _HashNode *p_Var4;
  SQString *pSVar5;
  ulong uVar6;
  bool bVar7;
  SQInteger SVar8;
  long lVar9;
  SQTable *pSVar10;
  
  SVar3 = (self->super_SQObject)._type;
  if ((int)SVar3 < 0x8004000) {
    if (SVar3 == OT_STRING) {
      SVar3 = (key->super_SQObject)._type;
      if ((SVar3 >> 0x1a & 1) != 0) {
        if (SVar3 == OT_FLOAT) {
          pSVar10 = (SQTable *)(long)(key->super_SQObject)._unVal.fFloat;
        }
        else {
          pSVar10 = (key->super_SQObject)._unVal.pTable;
        }
        pSVar5 = (self->super_SQObject)._unVal.pString;
        uVar6 = pSVar5->_len;
        lVar9 = (long)&(pSVar10->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                       _vptr_SQRefCounted + ((long)pSVar10 >> 0x3f & uVar6);
        if (lVar9 < (long)uVar6 && -1 < lVar9) {
          cVar2 = pSVar5->_val[lVar9];
          if (((dest->super_SQObject)._type & 0x8000000) != 0) {
            pSVar1 = &(((dest->super_SQObject)._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              (*(((dest->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._vptr_SQRefCounted[2])();
            }
          }
          (dest->super_SQObject)._type = OT_INTEGER;
          (dest->super_SQObject)._unVal = (SQObjectValue)(long)cVar2;
          return true;
        }
        goto LAB_0012dc6c;
      }
      goto LAB_0012db57;
    }
    if ((SVar3 != OT_ARRAY) || (SVar3 = (key->super_SQObject)._type, (SVar3 >> 0x1a & 1) == 0))
    goto LAB_0012db57;
    if (SVar3 == OT_FLOAT) {
      SVar8 = (SQInteger)(key->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar8 = (key->super_SQObject)._unVal.nInteger;
    }
    bVar7 = SQArray::Get((self->super_SQObject)._unVal.pArray,SVar8,dest);
  }
  else {
    if (SVar3 == OT_CLASS) {
      bVar7 = SQClass::Get((self->super_SQObject)._unVal.pClass,key,dest);
    }
    else if (SVar3 == OT_INSTANCE) {
      bVar7 = SQInstance::Get((self->super_SQObject)._unVal.pInstance,key,dest);
    }
    else {
      if (SVar3 != OT_TABLE) goto LAB_0012db57;
      bVar7 = SQTable::Get((self->super_SQObject)._unVal.pTable,key,dest);
    }
    if (bVar7 != false) {
      return true;
    }
LAB_0012db57:
    if ((getflags & 1) == 0) {
      SVar8 = FallBackGet(this,self,key,dest);
      if (SVar8 == 0) {
        return true;
      }
      if (SVar8 == 2) {
        return false;
      }
      bVar7 = InvokeDefaultDelegate(this,self,key,dest);
      if (bVar7) {
        return true;
      }
    }
    if ((selfidx != 0) ||
       (p_Var4 = ((this->ci->_closure).super_SQObject._unVal.pTable)->_firstfree,
       (p_Var4->key).super_SQObject._unVal.fFloat == 2.350989e-38)) goto LAB_0012dc6c;
    bVar7 = Get(this,(SQObjectPtr *)&(p_Var4->key).super_SQObject._unVal,key,dest,0,0x29a);
  }
  if (bVar7 != false) {
    return true;
  }
LAB_0012dc6c:
  if ((getflags & 2) == 0) {
    Raise_IdxError(this,key);
  }
  return false;
}

Assistant:

bool SQVM::Get(const SQObjectPtr &self, const SQObjectPtr &key, SQObjectPtr &dest, SQUnsignedInteger getflags, SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Get(key,dest))return true;
        break;
    case OT_ARRAY:
        if (sq_isnumeric(key)) { if (_array(self)->Get(tointeger(key), dest)) { return true; } if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key); return false; }
        break;
    case OT_INSTANCE:
        if(_instance(self)->Get(key,dest)) return true;
        break;
    case OT_CLASS:
        if(_class(self)->Get(key,dest)) return true;
        break;
    case OT_STRING:
        if(sq_isnumeric(key)){
            SQInteger n = tointeger(key);
            SQInteger len = _string(self)->_len;
            if (n < 0) { n += len; }
            if (n >= 0 && n < len) {
                dest = SQInteger(_stringval(self)[n]);
                return true;
            }
            if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
            return false;
        }
        break;
    default:break; //shut up compiler
    }
    if ((getflags & GET_FLAG_RAW) == 0) {
        switch(FallBackGet(self,key,dest)) {
            case FALLBACK_OK: return true; //okie
            case FALLBACK_NO_MATCH: break; //keep falling back
            case FALLBACK_ERROR: return false; // the metamethod failed
        }
        if(InvokeDefaultDelegate(self,key,dest)) {
            return true;
        }
    }
//#ifdef ROOT_FALLBACK
    if(selfidx == 0) {
        SQWeakRef *w = _closure(ci->_closure)->_root;
        if(type(w->_obj) != OT_NULL)
        {
            if(Get(*((const SQObjectPtr *)&w->_obj),key,dest,0,DONT_FALL_BACK)) return true;
        }

    }
//#endif
    if ((getflags & GET_FLAG_DO_NOT_RAISE_ERROR) == 0) Raise_IdxError(key);
    return false;
}